

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::RangeSelectExpression::fromSyntax
          (RangeSelectExpression *this,Compilation *compilation,Expression *value,
          RangeSelectSyntax *syntax,SourceRange fullRange,ASTContext *context)

{
  SymbolKind SVar1;
  SourceLocation SVar2;
  ulong uVar3;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  bool bVar4;
  SourceRange valueRange_00;
  bool bVar5;
  int iVar6;
  _Storage<int,_true> _Var7;
  int iVar8;
  Expression *pEVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type *this_00;
  RangeSelectExpression *pRVar10;
  QueueType *pQVar11;
  optional<int> oVar12;
  ConstantValue *pCVar13;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_01;
  Diagnostic *pDVar14;
  PackedArrayType *pPVar15;
  logic_error *this_02;
  long *plVar16;
  size_type *psVar17;
  long *plVar18;
  char *pcVar19;
  uint uVar20;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *args_1;
  _Storage<slang::ConstantRange,_true> *args_1_00;
  Type *pTVar22;
  int32_t l;
  _Storage<int,_true> r;
  socklen_t __len;
  SourceRange SVar23;
  SourceRange range;
  optional<slang::ConstantRange> oVar24;
  RangeSelectExpression *result;
  RangeSelectionKind selectionKind;
  ConstantRange valueRange;
  ConstantValue leftVal;
  SourceRange errorRange;
  anon_class_40_5_26fa91f2 validateRange;
  RangeSelectExpression *local_168;
  RangeSelectionKind local_15c;
  SourceLocation local_158;
  ConstantRange local_150;
  _Storage<slang::ConstantRange,_true> local_148;
  Type *local_140;
  Type *local_138;
  SourceRange local_130;
  undefined1 local_120 [32];
  __index_type local_100;
  string local_f8;
  undefined1 local_d8 [32];
  RangeSelectExpression **local_b8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_b0;
  char local_90;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_88;
  char local_68;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_60;
  long local_38;
  SourceLocation SVar21;
  
  local_158 = fullRange.endLoc;
  local_130.endLoc = fullRange.startLoc;
  iVar6 = *(int *)&(value->type).ptr;
  local_130.startLoc = (SourceLocation)syntax;
  if (iVar6 == 0x1b) {
    local_15c = IndexedUp;
  }
  else if (iVar6 == 0x88) {
    local_15c = IndexedDown;
  }
  else {
    if (iVar6 != 0x19b) {
      this_02 = (logic_error *)__cxa_allocate_exception(0x10);
      local_60._0_8_ = (long)&local_60 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/SelectExpressions.cpp"
                 ,"");
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_120._0_8_ = *plVar16;
      psVar17 = (size_type *)(plVar16 + 2);
      if ((size_type *)local_120._0_8_ == psVar17) {
        local_120._16_8_ = *psVar17;
        local_120._24_8_ = plVar16[3];
        local_120._0_8_ = local_120 + 0x10;
      }
      else {
        local_120._16_8_ = *psVar17;
      }
      local_120._8_8_ = plVar16[1];
      *plVar16 = (long)psVar17;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::__cxx11::to_string(&local_f8,0x1a2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     &local_f8);
      plVar16 = (long *)std::__cxx11::string::append(local_d8);
      local_88._0_8_ = *plVar16;
      plVar18 = plVar16 + 2;
      if ((long *)local_88._0_8_ == plVar18) {
        local_88._16_8_ = *plVar18;
        local_88._24_8_ = plVar16[3];
        local_88._0_8_ = (long)&local_88 + 0x10;
      }
      else {
        local_88._16_8_ = *plVar18;
      }
      local_88._8_8_ = plVar16[1];
      *plVar16 = (long)plVar18;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_b0._0_8_ = *plVar16;
      plVar18 = plVar16 + 2;
      if ((long *)local_b0._0_8_ == plVar18) {
        local_b0._16_8_ = *plVar18;
        local_b0._24_8_ = plVar16[3];
        local_b0._0_8_ = (long)&local_b0 + 0x10;
      }
      else {
        local_b0._16_8_ = *plVar18;
      }
      local_b0._8_8_ = plVar16[1];
      *plVar16 = (long)plVar18;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      std::logic_error::logic_error(this_02,(string *)&local_b0);
      __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_15c = Simple;
  }
  bVar5 = Expression::bad((Expression *)compilation);
  if (bVar5) {
LAB_003b52b8:
    pTVar22 = (Type *)(compilation->super_BumpAllocator).endPtr;
    if (pTVar22 != (Type *)0x0) {
      if (pTVar22->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar22);
      }
      SVar21 = local_158;
      SVar1 = (pTVar22->canonical->super_Symbol).kind;
      __len = 0x1800;
      if (SVar1 != QueueType) {
        __len = 0;
      }
      if (value->constant != (ConstantValue *)0x0) {
        iVar6 = Expression::bind((int)value->constant,(sockaddr *)local_158,__len);
        pRVar10 = (RangeSelectExpression *)CONCAT44(extraout_var,iVar6);
        SVar2 = (value->sourceRange).endLoc;
        if (SVar2 != (SourceLocation)0x0) {
          iVar6 = Expression::bind(SVar2._0_4_,(sockaddr *)SVar21,__len);
          pEVar9 = (Expression *)CONCAT44(extraout_var_00,iVar6);
          local_168 = BumpAllocator::
                      emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const&,slang::ast::Expression_const&,slang::SourceRange&>
                                ((BumpAllocator *)this,&local_15c,
                                 *(Type **)&this[4].super_Expression,(Expression *)compilation,
                                 (Expression *)pRVar10,pEVar9,&local_130);
          bVar5 = Expression::bad((Expression *)compilation);
          if (((bVar5) || (bVar5 = Expression::bad((Expression *)pRVar10), bVar5)) ||
             (bVar5 = Expression::bad(pEVar9), bVar5)) goto LAB_003b544a;
          pTVar22 = (pRVar10->super_Expression).type.ptr;
          if (pTVar22 == (Type *)0x0) goto LAB_003b5b07;
          if (pTVar22->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar22);
          }
          if (((pTVar22->canonical->super_Symbol).kind != UnboundedType) &&
             (bVar5 = ASTContext::requireIntegral((ASTContext *)local_158,(Expression *)pRVar10),
             !bVar5)) goto LAB_003b544a;
          pTVar22 = (pEVar9->type).ptr;
          if (pTVar22 == (Type *)0x0) goto LAB_003b5b07;
          if (pTVar22->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar22);
          }
          if (((pTVar22->canonical->super_Symbol).kind != UnboundedType) &&
             (bVar5 = ASTContext::requireIntegral((ASTContext *)local_158,pEVar9), !bVar5))
          goto LAB_003b544a;
          pTVar22 = (Type *)(compilation->super_BumpAllocator).endPtr;
          if (pTVar22 == (Type *)0x0) goto LAB_003b5b07;
          SVar23 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)value);
          SVar21 = SVar23.endLoc;
          valueRange_00.startLoc._0_4_ = (compilation->options).maxConstexprBacktrace;
          valueRange_00.startLoc._4_4_ = (compilation->options).maxDefParamSteps;
          valueRange_00.endLoc._0_4_ = (compilation->options).maxInstanceArray;
          valueRange_00.endLoc._4_4_ = (compilation->options).errorLimit;
          this_00 = getIndexedType((Compilation *)this,(ASTContext *)local_158,pTVar22,SVar23,
                                   valueRange_00,true);
          if (this_00->canonical == (Type *)0x0) {
            Type::resolveCanonical(this_00);
          }
          SVar2 = local_158;
          if ((this_00->canonical->super_Symbol).kind == ErrorType) goto LAB_003b544a;
          range.endLoc = local_158;
          range.startLoc = local_130.endLoc;
          checkForVectoredSelect
                    ((ast *)compilation,(Expression *)local_130.startLoc,range,(ASTContext *)SVar21)
          ;
          bVar5 = Type::hasFixedRange(pTVar22);
          if ((!bVar5) && ((*(byte *)((long)SVar2 + 0x10) & 0x80) != 0)) {
            sourceRange.endLoc = local_130.endLoc;
            sourceRange.startLoc = local_130.startLoc;
            ASTContext::addDiag((ASTContext *)SVar2,(DiagCode)0x420007,sourceRange);
            goto LAB_003b544a;
          }
          if (SVar1 == QueueType) {
            args_1 = &local_b0;
LAB_003b54b0:
            *(uint *)args_1 = 0;
            pQVar11 = BumpAllocator::
                      emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int>
                                ((BumpAllocator *)this,this_00,(uint *)args_1);
            if (pQVar11 != (QueueType *)0x0) {
              (local_168->super_Expression).type.ptr = &pQVar11->super_Type;
              return &local_168->super_Expression;
            }
            pcVar19 = 
            "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = slang::ast::QueueType *]"
            ;
            goto LAB_003b5c30;
          }
          uVar3 = *(ulong *)((long)SVar2 + 0x10);
          if ((uVar3 >> 0x23 & 1) != 0) {
            bVar5 = true;
            local_140 = pTVar22;
            if ((uVar3 & 2) == 0) {
              ASTContext::tryEval((ConstantValue *)&local_b0,(ASTContext *)local_158,pEVar9);
              if (local_90 == '\0') {
                bVar4 = false;
              }
              else if (local_15c == Simple) {
                ASTContext::tryEval((ConstantValue *)&local_88,(ASTContext *)local_158,
                                    (Expression *)pRVar10);
                bVar5 = local_68 == '\0';
                bVar4 = true;
              }
              else {
                bVar4 = false;
                bVar5 = false;
              }
            }
            else {
              bVar4 = false;
            }
            if (bVar4) {
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&local_88);
            }
            if ((uVar3 & 2) == 0) {
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)&local_b0);
            }
            pTVar22 = local_140;
            if (bVar5) {
              args_1 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                        *)local_d8;
              goto LAB_003b54b0;
            }
          }
          SVar21 = local_158;
          oVar12 = ASTContext::evalInteger((ASTContext *)local_158,pEVar9);
          if (((ulong)oVar12.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
LAB_003b544a:
            pRVar10 = (RangeSelectExpression *)
                      Expression::badExpr((Compilation *)this,&local_168->super_Expression);
            return &pRVar10->super_Expression;
          }
          local_f8._M_dataplus._M_p = *(pointer *)&(pRVar10->super_Expression).sourceRange.startLoc;
          local_f8._M_string_length = *(size_type *)&(pEVar9->sourceRange).endLoc;
          local_138 = this_00;
          bVar5 = Type::hasFixedRange(pTVar22);
          r._M_value = oVar12.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>._M_payload;
          if (bVar5) {
            local_148 = (_Storage<slang::ConstantRange,_true>)0x0;
            local_150 = Type::getFixedRange(pTVar22);
            local_d8._0_8_ = &local_150;
            local_d8._8_8_ = SVar21;
            local_d8._16_8_ = &local_f8;
            local_b8 = &local_168;
            local_d8._24_8_ = pTVar22;
            if (local_15c == Simple) {
              oVar12 = ASTContext::evalInteger((ASTContext *)SVar21,(Expression *)pRVar10);
              if (((ulong)oVar12.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int> & 0x100000000) != 0) {
                _Var7._M_value =
                     oVar12.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_payload;
                local_148._M_value.right = r._M_value;
                local_148._M_value.left = _Var7._M_value;
                if ((_Var7._M_value == r._M_value) ||
                   (r._M_value <= _Var7._M_value != local_150.left < local_150.right)) {
                  bVar5 = true;
                  if ((*(byte *)((long)SVar21 + 0x10) & 2) == 0) {
                    fromSyntax::anon_class_40_5_26fa91f2::operator()
                              ((anon_class_40_5_26fa91f2 *)local_d8,local_148._M_value);
                  }
                  goto LAB_003b5a78;
                }
                sourceRange_00.endLoc = (SourceLocation)local_f8._M_string_length;
                sourceRange_00.startLoc = (SourceLocation)local_f8._M_dataplus._M_p;
                pDVar14 = ASTContext::addDiag((ASTContext *)SVar21,(DiagCode)0x840007,sourceRange_00
                                             );
                ast::operator<<(pDVar14,pTVar22);
              }
              pRVar10 = (RangeSelectExpression *)
                        Expression::badExpr((Compilation *)this,&local_168->super_Expression);
              bVar5 = false;
LAB_003b5a78:
              if (bVar5) {
                bVar5 = Type::isUnpackedArray(pTVar22);
                args_1_00 = &local_148;
                if (bVar5) goto LAB_003b5a93;
                pPVar15 = BumpAllocator::
                          emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                                    ((BumpAllocator *)this,local_138,&args_1_00->_M_value);
                if (pPVar15 == (PackedArrayType *)0x0) {
                  pcVar19 = 
                  "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = slang::ast::PackedArrayType *]"
                  ;
                  goto LAB_003b5c30;
                }
                goto LAB_003b5ad3;
              }
            }
            else {
              bVar5 = ASTContext::requireGtZero((ASTContext *)SVar21,oVar12,pEVar9->sourceRange);
              if (bVar5) {
                local_100 = '\0';
                uVar3 = *(ulong *)((long)SVar21 + 0x10);
                local_140 = pTVar22;
                if ((uVar3 & 2) == 0) {
                  ASTContext::tryEval((ConstantValue *)&local_60,(ASTContext *)SVar21,
                                      (Expression *)pRVar10);
                  pCVar13 = ConstantValue::operator=
                                      ((ConstantValue *)local_120,(ConstantValue *)&local_60);
                  bVar5 = *(__index_type *)
                           ((long)&(pCVar13->value).
                                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   .
                                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           + 0x20) != '\0';
                }
                else {
                  bVar5 = false;
                }
                if ((uVar3 & 2) == 0) {
                  std::__detail::__variant::
                  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)&local_60);
                }
                SVar21 = local_158;
                if (bVar5) {
                  this_01 = std::
                            get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                      ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                        *)local_120);
                  pTVar22 = local_140;
                  oVar12 = SVInt::as<int,void>(this_01);
                  if (((ulong)oVar12.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int> & 0x100000000) == 0) {
                    pDVar14 = ASTContext::addDiag((ASTContext *)SVar21,(DiagCode)0x510007,
                                                  (pRVar10->super_Expression).sourceRange);
                    Diagnostic::operator<<(pDVar14,(ConstantValue *)local_120);
                    ast::operator<<(pDVar14,pTVar22);
                    pRVar10 = (RangeSelectExpression *)
                              Expression::badExpr((Compilation *)this,&local_168->super_Expression);
                    uVar20 = 0;
                  }
                  else {
                    oVar24 = ConstantRange::getIndexedRange
                                       (oVar12.super__Optional_base<int,_true,_true>._M_payload.
                                        super__Optional_payload_base<int>._M_payload,r._M_value,
                                        local_150.right <= local_150.left,local_15c == IndexedUp);
                    uVar20 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>.
                             _M_payload.super__Optional_payload_base<slang::ConstantRange>._8_4_;
                    if (((undefined1  [12])
                         oVar24.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1)
                        == (undefined1  [12])0x0) {
                      sourceRange_03.endLoc = (SourceLocation)local_f8._M_string_length;
                      sourceRange_03.startLoc = (SourceLocation)local_f8._M_dataplus._M_p;
                      ASTContext::addDiag((ASTContext *)local_158,(DiagCode)0x7b0007,sourceRange_03)
                      ;
                      pRVar10 = (RangeSelectExpression *)
                                Expression::badExpr((Compilation *)this,&local_168->super_Expression
                                                   );
                    }
                    else {
                      local_148 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>.
                                  _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                  _M_payload;
                      fromSyntax::anon_class_40_5_26fa91f2::operator()
                                ((anon_class_40_5_26fa91f2 *)local_d8,
                                 oVar24.super__Optional_base<slang::ConstantRange,_true,_true>.
                                 _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                 _M_payload._M_value);
                    }
                  }
                  if ((uVar20 & 1) == 0) {
                    bVar5 = false;
                  }
                  else {
LAB_003b5a66:
                    bVar5 = true;
                  }
                }
                else {
                  if (local_15c == IndexedUp) {
                    l = local_150.left;
                    if (local_150.right < local_150.left) {
                      l = local_150.right;
                    }
                  }
                  else {
                    l = local_150.right;
                    if (local_150.right < local_150.left) {
                      l = local_150.left;
                    }
                  }
                  oVar24 = ConstantRange::getIndexedRange
                                     (l,r._M_value,local_150.right <= local_150.left,
                                      local_15c == IndexedUp);
                  if (((undefined1  [12])
                       oVar24.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1)
                      == (undefined1  [12])0x0) {
                    sourceRange_02.endLoc = (SourceLocation)local_f8._M_string_length;
                    sourceRange_02.startLoc = (SourceLocation)local_f8._M_dataplus._M_p;
                    ASTContext::addDiag((ASTContext *)local_158,(DiagCode)0x7b0007,sourceRange_02);
                    pRVar10 = (RangeSelectExpression *)
                              Expression::badExpr((Compilation *)this,&local_168->super_Expression);
                  }
                  else {
                    iVar8 = local_150.left - local_150.right;
                    iVar6 = -iVar8;
                    if (0 < iVar8) {
                      iVar6 = iVar8;
                    }
                    local_148 = oVar24.super__Optional_base<slang::ConstantRange,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                _M_payload;
                    if ((uint)(iVar6 + 1) < (uint)r) {
                      pDVar14 = ASTContext::addDiag((ASTContext *)local_158,(DiagCode)0x9f0007,
                                                    pEVar9->sourceRange);
                      local_38 = (long)r._M_value;
                      std::
                      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                      ::emplace_back<long>(&pDVar14->args,&local_38);
                      ast::operator<<(pDVar14,local_140);
                    }
                  }
                  pTVar22 = local_140;
                  if (((undefined1  [12])
                       oVar24.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1)
                      != (undefined1  [12])0x0) goto LAB_003b5a66;
                  bVar5 = false;
                }
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)local_120);
                goto LAB_003b5a78;
              }
LAB_003b5703:
              pRVar10 = (RangeSelectExpression *)
                        Expression::badExpr((Compilation *)this,&local_168->super_Expression);
            }
LAB_003b5abc:
            bVar5 = false;
          }
          else {
            local_120._0_8_ = 0;
            if (local_15c == Simple) {
              oVar12 = ASTContext::evalInteger((ASTContext *)SVar21,(Expression *)pRVar10);
              if (((ulong)oVar12.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int> & 0x100000000) == 0) {
LAB_003b5817:
                pRVar10 = (RangeSelectExpression *)
                          Expression::badExpr((Compilation *)this,&local_168->super_Expression);
                bVar5 = false;
              }
              else {
                local_120._0_8_ =
                     CONCAT44(r._M_value,
                              oVar12.super__Optional_base<int,_true,_true>._M_payload.
                              super__Optional_payload_base<int>._M_payload);
                if (r._M_value <
                    oVar12.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_payload) {
                  sourceRange_01.endLoc = (SourceLocation)local_f8._M_string_length;
                  sourceRange_01.startLoc = (SourceLocation)local_f8._M_dataplus._M_p;
                  pDVar14 = ASTContext::addDiag((ASTContext *)SVar21,(DiagCode)0x830007,
                                                sourceRange_01);
                  local_d8._0_8_ = SEXT48((int)local_120._0_4_);
                  std::
                  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                  ::emplace_back<long>(&pDVar14->args,(long *)local_d8);
                  local_d8._0_8_ = SEXT48((int)local_120._4_4_);
                  std::
                  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
                  ::emplace_back<long>(&pDVar14->args,(long *)local_d8);
                  ast::operator<<(pDVar14,pTVar22);
                  goto LAB_003b5817;
                }
                bVar5 = true;
              }
              if (!bVar5) goto LAB_003b5abc;
            }
            else {
              bVar5 = ASTContext::requireGtZero((ASTContext *)SVar21,oVar12,pEVar9->sourceRange);
              if (!bVar5) goto LAB_003b5703;
              local_120._0_8_ = (ulong)(r._M_value - 1) << 0x20;
            }
            args_1_00 = (_Storage<slang::ConstantRange,_true> *)local_120;
LAB_003b5a93:
            pPVar15 = (PackedArrayType *)
                      BumpAllocator::
                      emplace<slang::ast::FixedSizeUnpackedArrayType,slang::ast::Type_const&,slang::ConstantRange&>
                                ((BumpAllocator *)this,local_138,&args_1_00->_M_value);
            if (pPVar15 == (PackedArrayType *)0x0) {
              pcVar19 = 
              "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = slang::ast::FixedSizeUnpackedArrayType *]"
              ;
LAB_003b5c30:
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x1b,pcVar19);
            }
LAB_003b5ad3:
            (local_168->super_Expression).type.ptr = (Type *)pPVar15;
            bVar5 = true;
          }
          if (!bVar5) {
            return &pRVar10->super_Expression;
          }
          return &local_168->super_Expression;
        }
      }
      pcVar19 = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_003b5b1c;
    }
  }
  else {
    pTVar22 = (Type *)(compilation->super_BumpAllocator).endPtr;
    if (pTVar22 != (Type *)0x0) {
      if (pTVar22->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar22);
      }
      if ((pTVar22->canonical->super_Symbol).kind == AssociativeArrayType) {
        SVar23.endLoc = local_130.endLoc;
        SVar23.startLoc = local_130.startLoc;
        ASTContext::addDiag((ASTContext *)local_158,(DiagCode)0x7a0007,SVar23);
        pEVar9 = Expression::badExpr((Compilation *)this,(Expression *)0x0);
        return pEVar9;
      }
      goto LAB_003b52b8;
    }
  }
LAB_003b5b07:
  pcVar19 = 
  "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_003b5b1c:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,pcVar19);
}

Assistant:

Expression& RangeSelectExpression::fromSyntax(Compilation& compilation, Expression& value,
                                              const RangeSelectSyntax& syntax,
                                              SourceRange fullRange, const ASTContext& context) {
    // Left and right are either the extents of a part-select, in which case they must
    // both be constant, or the left hand side is the start and the right hand side is
    // the width of an indexed part select, in which case only the rhs need be constant.
    RangeSelectionKind selectionKind;
    switch (syntax.kind) {
        case SyntaxKind::SimpleRangeSelect:
            selectionKind = RangeSelectionKind::Simple;
            break;
        case SyntaxKind::AscendingRangeSelect:
            selectionKind = RangeSelectionKind::IndexedUp;
            break;
        case SyntaxKind::DescendingRangeSelect:
            selectionKind = RangeSelectionKind::IndexedDown;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!value.bad() && value.type->isAssociativeArray()) {
        context.addDiag(diag::RangeSelectAssociative, fullRange);
        return badExpr(compilation, nullptr);
    }

    // Selection expressions don't need to be const if we're selecting from a queue.
    bitmask<ASTFlags> extraFlags;
    bool isQueue = value.type->isQueue();
    if (isQueue)
        extraFlags = ASTFlags::AllowUnboundedLiteral | ASTFlags::AllowUnboundedLiteralArithmetic;

    auto& left = bind(*syntax.left, context, extraFlags);
    auto& right = bind(*syntax.right, context, extraFlags);

    auto result = compilation.emplace<RangeSelectExpression>(selectionKind,
                                                             compilation.getErrorType(), value,
                                                             left, right, fullRange);

    if (value.bad() || left.bad() || right.bad())
        return badExpr(compilation, result);

    if (!left.type->isUnbounded() && !context.requireIntegral(left))
        return badExpr(compilation, result);

    if (!right.type->isUnbounded() && !context.requireIntegral(right))
        return badExpr(compilation, result);

    const Type& valueType = *value.type;
    const Type& elementType = getIndexedType(compilation, context, valueType, syntax.sourceRange(),
                                             value.sourceRange, true);
    if (elementType.isError())
        return badExpr(compilation, result);

    // Selects of vectored nets are disallowed.
    checkForVectoredSelect(value, fullRange, context);

    if (!valueType.hasFixedRange() && context.flags.has(ASTFlags::NonProcedural)) {
        context.addDiag(diag::DynamicNotProcedural, fullRange);
        return badExpr(compilation, result);
    }

    // If this is selecting from a queue, the result is always a queue.
    if (isQueue) {
        result->type = compilation.emplace<QueueType>(elementType, 0u);
        return *result;
    }

    // If this is a streaming concatenation's "with" range, we also don't
    // require a constant width, but we'll try to validate it if we see
    // that the bounds are constant anyway.
    if (context.flags.has(ASTFlags::StreamingWithRange)) {
        if (context.inUnevaluatedBranch() || !context.tryEval(right) ||
            (selectionKind == RangeSelectionKind::Simple && !context.tryEval(left))) {
            result->type = compilation.emplace<QueueType>(elementType, 0u);
            return *result;
        }
    }

    std::optional<int32_t> rv = context.evalInteger(right);
    if (!rv)
        return badExpr(compilation, result);

    // If the array type has a fixed range, validate that the range we're selecting is allowed.
    SourceRange errorRange{left.sourceRange.start(), right.sourceRange.end()};
    if (valueType.hasFixedRange()) {
        ConstantRange selectionRange;
        ConstantRange valueRange = valueType.getFixedRange();

        // Helper function for validating the bounds of the selection.
        auto validateRange = [&](ConstantRange range) {
            if (!valueRange.containsPoint(range.left) || !valueRange.containsPoint(range.right)) {
                auto& diag = context.addDiag(diag::RangeOOB, errorRange);
                diag << range.left << range.right;
                diag << valueType;

                result->warnedAboutRange = true;
            }
        };

        if (selectionKind == RangeSelectionKind::Simple) {
            std::optional<int32_t> lv = context.evalInteger(left);
            if (!lv)
                return badExpr(compilation, result);

            selectionRange = {*lv, *rv};
            if (selectionRange.isLittleEndian() != valueRange.isLittleEndian() &&
                selectionRange.width() > 1) {
                auto& diag = context.addDiag(diag::SelectEndianMismatch, errorRange);
                diag << valueType;
                return badExpr(compilation, result);
            }

            if (!context.inUnevaluatedBranch())
                validateRange(selectionRange);
        }
        else {
            if (!context.requireGtZero(rv, right.sourceRange))
                return badExpr(compilation, result);

            // If the lhs is a known constant, we can check that now too.
            ConstantValue leftVal;
            if (!context.inUnevaluatedBranch() && (leftVal = context.tryEval(left))) {
                std::optional<int32_t> index = leftVal.integer().as<int32_t>();
                if (!index) {
                    auto& diag = context.addDiag(diag::IndexValueInvalid, left.sourceRange);
                    diag << leftVal;
                    diag << valueType;
                    return badExpr(compilation, result);
                }

                auto range =
                    ConstantRange::getIndexedRange(*index, *rv, valueRange.isLittleEndian(),
                                                   selectionKind == RangeSelectionKind::IndexedUp);
                if (!range) {
                    context.addDiag(diag::RangeWidthOverflow, errorRange);
                    return badExpr(compilation, result);
                }

                selectionRange = *range;
                validateRange(selectionRange);
            }
            else {
                // Otherwise, the resulting range will start with the fixed lower bound of the type.
                int32_t l = selectionKind == RangeSelectionKind::IndexedUp ? valueRange.lower()
                                                                           : valueRange.upper();
                auto range = ConstantRange::getIndexedRange(l, *rv, valueRange.isLittleEndian(),
                                                            selectionKind ==
                                                                RangeSelectionKind::IndexedUp);
                if (!range) {
                    context.addDiag(diag::RangeWidthOverflow, errorRange);
                    return badExpr(compilation, result);
                }

                selectionRange = *range;

                if (bitwidth_t(*rv) > valueRange.width()) {
                    auto& diag = context.addDiag(diag::RangeWidthOOB, right.sourceRange);
                    diag << *rv;
                    diag << valueType;
                }
            }
        }

        // At this point, all expressions are good, ranges have been validated and
        // we know the final width of the selection, so pick the result type and we're done.
        if (valueType.isUnpackedArray()) {
            result->type = compilation.emplace<FixedSizeUnpackedArrayType>(elementType,
                                                                           selectionRange);
        }
        else {
            result->type = compilation.emplace<PackedArrayType>(elementType, selectionRange);
        }
    }
    else {
        // Otherwise, this is a dynamic array so we can't validate much. We should check that
        // the selection endianness is correct for simple ranges -- dynamic arrays only
        // permit big endian [0..N] ordering.
        ConstantRange selectionRange;
        if (selectionKind == RangeSelectionKind::Simple) {
            std::optional<int32_t> lv = context.evalInteger(left);
            if (!lv)
                return badExpr(compilation, result);

            selectionRange = {*lv, *rv};
            if (selectionRange.isLittleEndian() && selectionRange.width() > 1) {
                auto& diag = context.addDiag(diag::SelectEndianDynamic, errorRange);
                diag << selectionRange.left << selectionRange.right;
                diag << valueType;
                return badExpr(compilation, result);
            }
        }
        else {
            if (!context.requireGtZero(rv, right.sourceRange))
                return badExpr(compilation, result);

            selectionRange.left = 0;
            selectionRange.right = *rv - 1;
        }

        result->type = compilation.emplace<FixedSizeUnpackedArrayType>(elementType, selectionRange);
    }

    return *result;
}